

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::BufferObjectQueryTests::init
          (BufferObjectQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  TestContext *pTVar3;
  undefined4 extraout_var;
  ApiCase *pAVar4;
  long *plVar5;
  long *extraout_RAX;
  long *plVar6;
  BufferParamVerifier *verifier;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pTVar3 = (TestContext *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&pTVar3->m_rootArchive,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  pTVar3->m_watchDog = (qpWatchDog *)"_getbufferparameteri";
  *(undefined1 *)&pTVar3->m_cmdLine = 1;
  pTVar3->m_platform = (Platform *)&PTR__BufferParamVerifier_021307c8;
  this->m_verifierInt = (GetBufferParameterIVerifier *)pTVar3;
  pAVar4 = (ApiCase *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ApiCase::ApiCase(pAVar4,pCVar1,(char *)local_50,"BUFFER_SIZE");
  *(undefined4 *)&pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  pAVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
  (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02130880;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pAVar4 = (ApiCase *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_usage","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ApiCase::ApiCase(pAVar4,pCVar1,(char *)local_50,"BUFFER_USAGE");
  *(undefined4 *)&pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  pAVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
  (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_021308f8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  plVar5 = local_60;
  if (local_70[0] != plVar5) {
    operator_delete(local_70[0],local_60[0] + 1);
    plVar5 = extraout_RAX;
  }
  return (int)plVar5;
}

Assistant:

void BufferObjectQueryTests::init (void)
{
	using namespace BufferParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);

	m_verifierInt		= new GetBufferParameterIVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	BufferParamVerifier* verifiers[] = {m_verifierInt};

	FOR_EACH_VERIFIER(verifiers, addChild(new BufferSizeCase		(m_context, verifier,	(std::string("buffer_size")				+ verifier->getTestNamePostfix()).c_str(), "BUFFER_SIZE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new BufferUsageCase		(m_context, verifier,	(std::string("buffer_usage")			+ verifier->getTestNamePostfix()).c_str(), "BUFFER_USAGE")));
}